

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_logging.cc
# Opt level: O1

int __thiscall TCMalloc_Printer::printf(TCMalloc_Printer *this,char *__format,...)

{
  uint in_EAX;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  va_list ap;
  
  if ((char)in_EAX != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (0 < this->left_) {
    ap[0].overflow_arg_area = local_d8;
    ap[0]._0_8_ = &stack0x00000008;
    local_28 = 0x3000000010;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    in_EAX = vsnprintf(this->buf_,(long)this->left_,__format,&local_28);
    if (((int)in_EAX < 0) || (this->left_ < (int)in_EAX)) {
      this->left_ = 0;
    }
    else {
      this->left_ = this->left_ - in_EAX;
      this->buf_ = this->buf_ + in_EAX;
    }
  }
  return in_EAX;
}

Assistant:

void TCMalloc_Printer::printf(const char* format, ...) {
  if (left_ > 0) {
    va_list ap;
    va_start(ap, format);
    const int r = vsnprintf(buf_, left_, format, ap);
    va_end(ap);
    if (r < 0) {
      // Some kind of error
      left_ = 0;
    } else if (r > left_) {
      // Truncation
      left_ = 0;
    } else {
      left_ -= r;
      buf_ += r;
    }
  }
}